

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# happly.h
# Opt level: O0

void __thiscall happly::TypedProperty<short>::readNext(TypedProperty<short> *this,istream *stream)

{
  reference pvVar1;
  char *in_RSI;
  vector<short,_std::allocator<short>_> *in_RDI;
  
  geometrycentral::surface::std::vector<short,_std::allocator<short>_>::emplace_back<>(in_RDI);
  pvVar1 = geometrycentral::surface::std::vector<short,_std::allocator<short>_>::back(in_RDI);
  std::istream::read(in_RSI,(long)pvVar1);
  return;
}

Assistant:

virtual void readNext(std::istream& stream) override {
    data.emplace_back();
    stream.read((char*)&data.back(), sizeof(T));
  }